

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

bool __thiscall H264StreamReader::skipNal(H264StreamReader *this,uint8_t *nal)

{
  bool bVar1;
  pointer ppVar2;
  byte local_201;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_> local_1e8 [3];
  uint8_t *local_1d0;
  uint8_t *nextNal;
  SEIUnit sei;
  NALType nalType;
  uint8_t *nal_local;
  H264StreamReader *this_local;
  
  sei.m_mvcHeaderStart._4_4_ = *nal & 0x1f;
  if (sei.m_mvcHeaderStart._4_4_ == 0xc) {
    this_local._7_1_ = 1;
  }
  else if (((sei.m_mvcHeaderStart._4_4_ == 10) || (sei.m_mvcHeaderStart._4_4_ == 0xb)) &&
          ((((this->super_MPEGStreamReader).m_eof & 1U) == 0 ||
           (4 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nal
           )))) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              (&this->updatedSPSList);
    this_local._7_1_ = 1;
  }
  else if ((this->m_needSeiCorrection & 1U) == 0) {
    this_local._7_1_ = 0;
  }
  else if (((sei.m_mvcHeaderStart._4_4_ == 8) || (sei.m_mvcHeaderStart._4_4_ == 7)) ||
          (sei.m_mvcHeaderStart._4_4_ == 0xf)) {
    this_local._7_1_ = 1;
  }
  else {
    if (sei.m_mvcHeaderStart._4_4_ == 6) {
      SEIUnit::SEIUnit((SEIUnit *)&nextNal);
      local_1d0 = NALUnit::findNALWithStartCode
                            (nal,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,
                             true);
      NALUnit::decodeBuffer((NALUnit *)&nextNal,nal,local_1d0);
      local_1e8[0]._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
           ::begin(&this->m_spsMap);
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator->
                         (local_1e8);
      local_201 = 1;
      if ((this->orig_hrd_parameters_present_flag & 1U) == 0) {
        local_201 = this->orig_vcl_parameters_present_flag;
      }
      SEIUnit::deserialize((SEIUnit *)&nextNal,ppVar2->second,local_201 & 1);
      bVar1 = SEIUnit::hasProcessedMessage((SEIUnit *)&nextNal,0);
      if ((bVar1) || (bVar1 = SEIUnit::hasProcessedMessage((SEIUnit *)&nextNal,1), bVar1)) {
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      SEIUnit::~SEIUnit((SEIUnit *)&nextNal);
      if (bVar1) goto LAB_0029e47d;
    }
    this_local._7_1_ = 0;
  }
LAB_0029e47d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool H264StreamReader::skipNal(uint8_t *nal)
{
    const auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);

    if (nalType == NALUnit::NALType::nuFillerData)
        return true;

    if (nalType == NALUnit::NALType::nuEOSeq || nalType == NALUnit::NALType::nuEOStream)
    {
        if (!m_eof || m_bufEnd - nal > 4)
        {
            updatedSPSList.clear();
            return true;
        }
    }

    if (!m_needSeiCorrection)
        return false;

    if (nalType == NALUnit::NALType::nuPPS || nalType == NALUnit::NALType::nuSPS ||
        nalType == NALUnit::NALType::nuSubSPS)
    {
        return true;  // SPS/PPS will be composed from our side on writePesHeader. It is required to compose SPS/PPS
                      // before SEI
    }
    if (nalType == NALUnit::NALType::nuSEI)
    {
        SEIUnit sei;
        const uint8_t *nextNal = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
        sei.decodeBuffer(nal, nextNal);
        sei.deserialize(*(m_spsMap.begin()->second),
                        orig_hrd_parameters_present_flag || orig_vcl_parameters_present_flag);

        if (sei.hasProcessedMessage(SEI_MSG_BUFFERING_PERIOD) || sei.hasProcessedMessage(SEI_MSG_PIC_TIMING))
        {
            return true;
        }
    }
    return false;
}